

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rprog.c
# Opt level: O0

void entry_prog_sidhe_ankle(ROOM_INDEX_DATA *room,CHAR_DATA *ch)

{
  bool bVar1;
  int iVar2;
  long in_RSI;
  AFFECT_DATA af;
  undefined1 in_stack_000012d2;
  undefined1 in_stack_000012d3;
  int in_stack_000012d4;
  int in_stack_000012d8;
  int in_stack_000012dc;
  CHAR_DATA *in_stack_000012e0;
  CHAR_DATA *in_stack_000012e8;
  int in_stack_00001308;
  int in_stack_00001310;
  char *in_stack_00001318;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 uVar3;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  undefined4 uVar4;
  int in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff6c;
  char *in_stack_ffffffffffffff70;
  char *txt;
  
  bVar1 = is_affected_by((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                         in_stack_ffffffffffffff64);
  if ((((!bVar1) &&
       (bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)),
       !bVar1)) &&
      (bVar1 = is_immortal((CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)), !bVar1))
     && (iVar2 = number_percent(), 0x3b < iVar2)) {
    send_to_char(in_stack_ffffffffffffff70,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    act(in_stack_ffffffffffffff70,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
        (void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
        (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0);
    dice(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = 1;
    txt = "twisted ankle";
    damage_new(in_stack_000012e8,in_stack_000012e0,in_stack_000012dc,in_stack_000012d8,
               in_stack_000012d4,(bool)in_stack_000012d3,(bool)in_stack_000012d2,in_stack_00001308,
               in_stack_00001310,in_stack_00001318);
    iVar2 = number_percent();
    if ((iVar2 < 0x14) && (0 < *(short *)(in_RSI + 0x306))) {
      send_to_char(txt,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,uVar5));
      init_affect((AFFECT_DATA *)0x6bdc89);
      affect_to_char((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff64,uVar4),
                     (AFFECT_DATA *)CONCAT44(in_stack_ffffffffffffff5c,uVar3));
      affect_to_char((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff64,uVar4),
                     (AFFECT_DATA *)CONCAT44(in_stack_ffffffffffffff5c,uVar3));
    }
  }
  return;
}

Assistant:

void entry_prog_sidhe_ankle(ROOM_INDEX_DATA *room, CHAR_DATA *ch)
{
	AFFECT_DATA af;

	if (is_affected_by(ch, AFF_FLYING))
		return;

	if (is_npc(ch) || is_immortal(ch))
		return;

	if (number_percent() < 60)
		return;

	send_to_char("You feel a sharp pain in your ankle as your foot slips on a loose rock.\n\r", ch);
	act("$n winces in pain as $e twists his ankle on a loose rock.", ch, 0, 0, TO_ROOM);

	damage_new(ch, ch, dice(ch->level, 2), TYPE_UNDEFINED, DAM_BASH, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "twisted ankle");

	if (number_percent() < 20 && ch->legs > 0)
	{
		send_to_char("You feel a brutal *crack* as your weight comes down on your twisted ankle.\n\r", ch);

		init_affect(&af);
		af.where = TO_AFFECTS;
		af.duration = 12;
		af.type = gsn_hobble;
		af.level = ch->level;
		af.aftype = AFT_MALADY;
		af.location = APPLY_DEX;
		af.modifier = -4;
		affect_to_char(ch, &af);

		af.location = APPLY_LEGS;
		af.modifier = -1;
		af.aftype = AFT_INVIS;
		affect_to_char(ch, &af);
	}
}